

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileLibraryTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmMakefileLibraryTargetGenerator::WriteDeviceLibraryRules
          (cmMakefileLibraryTargetGenerator *this,string *linkRuleVar,bool relink)

{
  EchoProgress *this_00;
  cmMakefile *pcVar1;
  cmLocalUnixMakefileGenerator3 *pcVar2;
  cmGeneratorTarget *target_00;
  bool linkScriptShell;
  bool bVar3;
  bool forResponse;
  bool useWatcomQuote_00;
  TargetType TVar4;
  int iVar5;
  string *psVar6;
  pointer pcVar7;
  char *pcVar8;
  undefined4 extraout_var;
  pointer pcVar9;
  iterator iVar10;
  iterator iVar11;
  string *relDir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar12;
  cmOutputConverter *local_7a0;
  cmOutputConverter *local_700;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_669;
  undefined1 local_668 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  outputs;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_638;
  const_iterator local_630;
  char *local_628;
  char *name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands1;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_5f0;
  const_iterator local_5e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e0;
  reference local_5c0;
  string *real_link_command;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  string linkRule;
  unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
  rulePlaceholderExpander;
  string local_570;
  char *local_550;
  char *val;
  string launcher;
  string langFlags;
  string targetOutPathCompilePDB;
  string targetFullPathCompilePDB;
  undefined1 local_4a8 [8];
  string target;
  string local_468;
  undefined1 local_448 [8];
  string objectDir;
  undefined1 local_420 [4];
  OutputFormat output;
  string buildObjs;
  cmStateDirectory local_3e8;
  unique_ptr<cmLinkLineComputer,_std::default_delete<cmLinkLineComputer>_> local_3c0;
  unique_ptr<cmLinkLineComputer,_std::default_delete<cmLinkLineComputer>_> linkLineComputer;
  string linkLibs;
  undefined1 local_370 [7];
  bool useWatcomQuote;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  real_link_commands;
  RuleVariables vars;
  undefined1 local_228 [5];
  bool useResponseFileForLibs;
  bool useResponseFileForObjects;
  bool useLinkScript;
  undefined1 local_208 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  libCleanFiles;
  string local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  undefined1 local_190 [8];
  string buildEcho;
  EchoProgress progress;
  undefined1 local_110 [8];
  string targetOutputReal;
  string linkFlags;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  string local_b0;
  undefined1 local_90 [8];
  string objExt;
  allocator<char> local_59;
  undefined1 local_58 [8];
  string linkLanguage;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands;
  bool relink_local;
  string *linkRuleVar_local;
  cmMakefileLibraryTargetGenerator *this_local;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&linkLanguage.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_58,"CUDA",&local_59);
  std::allocator<char>::~allocator(&local_59);
  pcVar1 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"CMAKE_CUDA_OUTPUT_EXTENSION",
             (allocator<char> *)
             ((long)&depends.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  psVar6 = cmMakefile::GetSafeDefinition(pcVar1,&local_b0);
  std::__cxx11::string::string((string *)local_90,(string *)psVar6);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&depends.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  pvVar12 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&linkFlags.field_2 + 8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(pvVar12);
  cmMakefileTargetGenerator::AppendLinkDepends
            (&this->super_cmMakefileTargetGenerator,pvVar12,(string *)local_58);
  std::__cxx11::string::string((string *)(targetOutputReal.field_2._M_local_buf + 8));
  cmMakefileTargetGenerator::GetTargetLinkFlags
            (&this->super_cmMakefileTargetGenerator,
             (string *)(targetOutputReal.field_2._M_local_buf + 8),(string *)local_58);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&progress.Arg.field_2 + 8),
                 &((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                  GeneratorTarget)->ObjectDirectory,"cmake_device_link");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&progress.Arg.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90);
  std::__cxx11::string::~string((string *)(progress.Arg.field_2._M_local_buf + 8));
  std::__cxx11::string::operator=((string *)&this->DeviceLinkObject,(string *)local_110);
  (this->super_cmMakefileTargetGenerator).NumberOfProgressActions =
       (this->super_cmMakefileTargetGenerator).NumberOfProgressActions + 1;
  if (((this->super_cmMakefileTargetGenerator).NoRuleMessages & 1U) == 0) {
    this_00 = (EchoProgress *)((long)&buildEcho.field_2 + 8);
    cmLocalUnixMakefileGenerator3::EchoProgress::EchoProgress(this_00);
    cmMakefileTargetGenerator::MakeEchoProgress(&this->super_cmMakefileTargetGenerator,this_00);
    std::operator+(&local_1b0,"Linking ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_190,
                   &local_1b0," device code ");
    std::__cxx11::string::~string((string *)&local_1b0);
    pcVar2 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
    psVar6 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)pcVar2);
    cmLocalGenerator::MaybeConvertToRelativePath
              ((string *)
               &libCleanFiles.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(cmLocalGenerator *)pcVar2,psVar6
               ,&this->DeviceLinkObject);
    cmOutputConverter::ConvertToOutputFormat
              (&local_1d0,
               &(pcVar2->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,
               (string *)
               &libCleanFiles.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,SHELL);
    std::__cxx11::string::operator+=((string *)local_190,(string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::string::~string
              ((string *)
               &libCleanFiles.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    cmLocalUnixMakefileGenerator3::AppendEcho
              ((this->super_cmMakefileTargetGenerator).LocalGenerator,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&linkLanguage.field_2 + 8),(string *)local_190,EchoLink,
               (EchoProgress *)((long)&buildEcho.field_2 + 8));
    std::__cxx11::string::~string((string *)local_190);
    cmLocalUnixMakefileGenerator3::EchoProgress::~EchoProgress
              ((EchoProgress *)((long)&buildEcho.field_2 + 8));
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_208);
  pcVar2 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  psVar6 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)pcVar2);
  cmLocalGenerator::MaybeConvertToRelativePath
            ((string *)local_228,(cmLocalGenerator *)pcVar2,psVar6,(string *)local_110);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_208,(value_type *)local_228);
  std::__cxx11::string::~string((string *)local_228);
  linkScriptShell =
       cmGlobalGenerator::GetUseLinkScript
                 ((cmGlobalGenerator *)(this->super_cmMakefileTargetGenerator).GlobalGenerator);
  bVar3 = cmMakefileTargetGenerator::CheckUseResponseFileForObjects
                    (&this->super_cmMakefileTargetGenerator,(string *)local_58);
  forResponse = cmMakefileTargetGenerator::CheckUseResponseFileForLibraries
                          (&this->super_cmMakefileTargetGenerator,(string *)local_58);
  cmRulePlaceholderExpander::RuleVariables::RuleVariables
            ((RuleVariables *)
             &real_link_commands.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::c_str();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_370);
  pcVar1 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.Makefile;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&linkLibs.field_2 + 8),linkRuleVar,"_USE_WATCOM_QUOTE");
  useWatcomQuote_00 = cmMakefile::IsOn(pcVar1,(string *)((long)&linkLibs.field_2 + 8));
  std::__cxx11::string::~string((string *)(linkLibs.field_2._M_local_buf + 8));
  cmOutputConverter::SetLinkScriptShell
            (&(((this->super_cmMakefileTargetGenerator).LocalGenerator)->
              super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter,
             linkScriptShell);
  std::__cxx11::string::string((string *)&linkLineComputer);
  TVar4 = cmGeneratorTarget::GetType
                    ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                     GeneratorTarget);
  if (TVar4 != STATIC_LIBRARY) {
    pcVar7 = (pointer)operator_new(0x40);
    pcVar2 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
    local_700 = (cmOutputConverter *)0x0;
    if (pcVar2 != (cmLocalUnixMakefileGenerator3 *)0x0) {
      local_700 = &(pcVar2->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                   super_cmOutputConverter;
    }
    cmLocalGenerator::GetStateSnapshot
              ((cmStateSnapshot *)((long)&buildObjs.field_2 + 8),
               (cmLocalGenerator *)(this->super_cmMakefileTargetGenerator).LocalGenerator);
    cmStateSnapshot::GetDirectory(&local_3e8,(cmStateSnapshot *)((long)&buildObjs.field_2 + 8));
    cmLinkLineDeviceComputer::cmLinkLineDeviceComputer
              ((cmLinkLineDeviceComputer *)pcVar7,local_700,&local_3e8);
    std::unique_ptr<cmLinkLineComputer,std::default_delete<cmLinkLineComputer>>::
    unique_ptr<std::default_delete<cmLinkLineComputer>,void>
              ((unique_ptr<cmLinkLineComputer,std::default_delete<cmLinkLineComputer>> *)&local_3c0,
               pcVar7);
    pcVar7 = std::unique_ptr<cmLinkLineComputer,_std::default_delete<cmLinkLineComputer>_>::
             operator->(&local_3c0);
    cmLinkLineComputer::SetForResponse(pcVar7,forResponse);
    pcVar7 = std::unique_ptr<cmLinkLineComputer,_std::default_delete<cmLinkLineComputer>_>::
             operator->(&local_3c0);
    cmLinkLineComputer::SetUseWatcomQuote(pcVar7,useWatcomQuote_00);
    pcVar7 = std::unique_ptr<cmLinkLineComputer,_std::default_delete<cmLinkLineComputer>_>::
             operator->(&local_3c0);
    cmLinkLineComputer::SetRelink(pcVar7,relink);
    pcVar7 = std::unique_ptr<cmLinkLineComputer,_std::default_delete<cmLinkLineComputer>_>::get
                       (&local_3c0);
    cmMakefileTargetGenerator::CreateLinkLibs
              (&this->super_cmMakefileTargetGenerator,pcVar7,(string *)&linkLineComputer,forResponse
               ,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&linkFlags.field_2 + 8));
    std::unique_ptr<cmLinkLineComputer,_std::default_delete<cmLinkLineComputer>_>::~unique_ptr
              (&local_3c0);
  }
  std::__cxx11::string::string((string *)local_420);
  cmMakefileTargetGenerator::CreateObjectLists
            (&this->super_cmMakefileTargetGenerator,linkScriptShell,false,bVar3,(string *)local_420,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&linkFlags.field_2 + 8),useWatcomQuote_00);
  objectDir.field_2._12_4_ = ZEXT14(useWatcomQuote_00);
  cmGeneratorTarget::GetSupportDirectory_abi_cxx11_
            ((string *)local_448,
             (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget);
  pcVar2 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  psVar6 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)pcVar2);
  cmLocalGenerator::MaybeConvertToRelativePath
            ((string *)((long)&target.field_2 + 8),(cmLocalGenerator *)pcVar2,psVar6,
             (string *)local_448);
  cmOutputConverter::ConvertToOutputFormat
            (&local_468,
             &(pcVar2->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter,
             (string *)((long)&target.field_2 + 8),SHELL);
  std::__cxx11::string::operator=((string *)local_448,(string *)&local_468);
  std::__cxx11::string::~string((string *)&local_468);
  std::__cxx11::string::~string((string *)(target.field_2._M_local_buf + 8));
  pcVar2 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  psVar6 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)pcVar2);
  cmLocalGenerator::MaybeConvertToRelativePath
            ((string *)((long)&targetFullPathCompilePDB.field_2 + 8),(cmLocalGenerator *)pcVar2,
             psVar6,(string *)local_110);
  cmOutputConverter::ConvertToOutputFormat
            ((string *)local_4a8,
             &(pcVar2->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter,
             (string *)((long)&targetFullPathCompilePDB.field_2 + 8),objectDir.field_2._12_4_);
  std::__cxx11::string::~string((string *)(targetFullPathCompilePDB.field_2._M_local_buf + 8));
  cmCommonTargetGenerator::ComputeTargetCompilePDB_abi_cxx11_
            ((string *)((long)&targetOutPathCompilePDB.field_2 + 8),(cmCommonTargetGenerator *)this)
  ;
  cmOutputConverter::ConvertToOutputFormat
            ((string *)((long)&langFlags.field_2 + 8),
             &(((this->super_cmMakefileTargetGenerator).LocalGenerator)->
              super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter,
             (string *)((long)&targetOutPathCompilePDB.field_2 + 8),SHELL);
  std::__cxx11::string::c_str();
  std::__cxx11::string::c_str();
  std::__cxx11::string::c_str();
  std::__cxx11::string::c_str();
  std::__cxx11::string::c_str();
  std::__cxx11::string::c_str();
  std::__cxx11::string::c_str();
  std::__cxx11::string::string((string *)(launcher.field_2._M_local_buf + 8));
  cmLocalGenerator::AddLanguageFlagsForLinking
            ((cmLocalGenerator *)(this->super_cmMakefileTargetGenerator).LocalGenerator,
             (string *)(launcher.field_2._M_local_buf + 8),
             (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
             (string *)local_58,
             &(this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.ConfigName);
  std::__cxx11::string::c_str();
  std::__cxx11::string::string((string *)&val);
  target_00 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
  pcVar2 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_570,"RULE_LAUNCH_LINK",
             (allocator<char> *)
             ((long)&rulePlaceholderExpander._M_t.
                     super___uniq_ptr_impl<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmRulePlaceholderExpander_*,_std::default_delete<cmRulePlaceholderExpander>_>
                     .super__Head_base<0UL,_cmRulePlaceholderExpander_*,_false>._M_head_impl + 7));
  pcVar8 = cmLocalGenerator::GetRuleLauncher((cmLocalGenerator *)pcVar2,target_00,&local_570);
  std::__cxx11::string::~string((string *)&local_570);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&rulePlaceholderExpander._M_t.
                     super___uniq_ptr_impl<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmRulePlaceholderExpander_*,_std::default_delete<cmRulePlaceholderExpander>_>
                     .super__Head_base<0UL,_cmRulePlaceholderExpander_*,_false>._M_head_impl + 7));
  local_550 = pcVar8;
  if ((pcVar8 != (char *)0x0) && (*pcVar8 != '\0')) {
    std::__cxx11::string::operator=((string *)&val,pcVar8);
    std::__cxx11::string::operator+=((string *)&val," ");
  }
  iVar5 = (*(((this->super_cmMakefileTargetGenerator).LocalGenerator)->super_cmLocalCommonGenerator)
            .super_cmLocalGenerator._vptr_cmLocalGenerator[5])();
  std::unique_ptr<cmRulePlaceholderExpander,std::default_delete<cmRulePlaceholderExpander>>::
  unique_ptr<std::default_delete<cmRulePlaceholderExpander>,void>
            ((unique_ptr<cmRulePlaceholderExpander,std::default_delete<cmRulePlaceholderExpander>> *
             )(linkRule.field_2._M_local_buf + 8),(pointer)CONCAT44(extraout_var,iVar5));
  pcVar9 = std::
           unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>::
           operator->((unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                       *)(linkRule.field_2._M_local_buf + 8));
  cmRulePlaceholderExpander::SetTargetImpLib(pcVar9,(string *)local_110);
  cmMakefileTargetGenerator::GetLinkRule
            ((string *)&__range1,&this->super_cmMakefileTargetGenerator,linkRuleVar);
  cmSystemTools::ExpandListArgument
            ((string *)&__range1,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_370,false);
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_370);
  real_link_command =
       (string *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_370);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&real_link_command);
    if (!bVar3) break;
    local_5c0 = __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&__end1);
    std::operator+(&local_5e0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&val,
                   local_5c0);
    std::__cxx11::string::operator=((string *)local_5c0,(string *)&local_5e0);
    std::__cxx11::string::~string((string *)&local_5e0);
    pcVar9 = std::
             unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
             ::operator->((unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                           *)((long)&linkRule.field_2 + 8));
    pcVar2 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
    local_7a0 = (cmOutputConverter *)0x0;
    if (pcVar2 != (cmLocalUnixMakefileGenerator3 *)0x0) {
      local_7a0 = &(pcVar2->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                   super_cmOutputConverter;
    }
    cmRulePlaceholderExpander::ExpandRuleVariables
              (pcVar9,local_7a0,local_5c0,
               (RuleVariables *)
               &real_link_commands.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  cmOutputConverter::SetLinkScriptShell
            (&(((this->super_cmMakefileTargetGenerator).LocalGenerator)->
              super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter,false);
  pvVar12 = &(this->super_cmMakefileTargetGenerator).CleanFiles;
  local_5f0._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(pvVar12);
  __gnu_cxx::
  __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::__normal_iterator<std::__cxx11::string*>
            ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              *)&local_5e8,&local_5f0);
  iVar10 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_208);
  iVar11 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_208);
  commands1.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           pvVar12,local_5e8,
                           (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            )iVar10._M_current,
                           (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            )iVar11._M_current);
  std::__cxx11::string::~string((string *)&__range1);
  std::unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>::
  ~unique_ptr((unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
               *)((long)&linkRule.field_2 + 8));
  std::__cxx11::string::~string((string *)&val);
  std::__cxx11::string::~string((string *)(launcher.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(langFlags.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(targetOutPathCompilePDB.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_4a8);
  std::__cxx11::string::~string((string *)local_448);
  std::__cxx11::string::~string((string *)local_420);
  std::__cxx11::string::~string((string *)&linkLineComputer);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&name);
  if (linkScriptShell) {
    local_628 = "dlink.txt";
    if (relink) {
      local_628 = "drelink.txt";
    }
    cmMakefileTargetGenerator::CreateLinkScript
              (&this->super_cmMakefileTargetGenerator,local_628,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_370,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&name,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)((long)&linkFlags.field_2 + 8));
  }
  else {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&name,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_370);
  }
  pcVar2 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  psVar6 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_
                     ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.Makefile
                     );
  relDir = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_
                     ((cmLocalGenerator *)(this->super_cmMakefileTargetGenerator).LocalGenerator);
  cmLocalUnixMakefileGenerator3::CreateCDCommand
            (pcVar2,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&name,psVar6,relDir);
  local_638._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(linkLanguage.field_2._M_local_buf + 8));
  __gnu_cxx::
  __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::__normal_iterator<std::__cxx11::string*>
            ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              *)&local_630,&local_638);
  iVar10 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&name);
  iVar11 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&name);
  outputs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           (linkLanguage.field_2._M_local_buf + 8),local_630,
                           (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            )iVar10._M_current,
                           (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            )iVar11._M_current);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&name);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_669);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_668,1,(value_type *)local_110,&local_669);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_669);
  cmMakefileTargetGenerator::WriteMakeRule
            (&this->super_cmMakefileTargetGenerator,
             (ostream *)(this->super_cmMakefileTargetGenerator).BuildFileStream,(char *)0x0,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_668,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&linkFlags.field_2 + 8),
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&linkLanguage.field_2 + 8),false);
  cmMakefileTargetGenerator::WriteTargetDriverRule
            (&this->super_cmMakefileTargetGenerator,(string *)local_110,relink);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_668);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&name);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_370);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_208);
  std::__cxx11::string::~string((string *)local_110);
  std::__cxx11::string::~string((string *)(targetOutputReal.field_2._M_local_buf + 8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&linkFlags.field_2 + 8));
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::~string((string *)local_58);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&linkLanguage.field_2 + 8));
  return;
}

Assistant:

void cmMakefileLibraryTargetGenerator::WriteDeviceLibraryRules(
  const std::string& linkRuleVar, bool relink)
{
#ifdef CMAKE_BUILD_WITH_CMAKE
  // TODO: Merge the methods that call this method to avoid
  // code duplication.
  std::vector<std::string> commands;

  // Get the language to use for linking this library.
  std::string linkLanguage = "CUDA";
  std::string const objExt =
    this->Makefile->GetSafeDefinition("CMAKE_CUDA_OUTPUT_EXTENSION");

  // Build list of dependencies.
  std::vector<std::string> depends;
  this->AppendLinkDepends(depends, linkLanguage);

  // Create set of linking flags.
  std::string linkFlags;
  this->GetTargetLinkFlags(linkFlags, linkLanguage);

  // Get the name of the device object to generate.
  std::string const targetOutputReal =
    this->GeneratorTarget->ObjectDirectory + "cmake_device_link" + objExt;
  this->DeviceLinkObject = targetOutputReal;

  this->NumberOfProgressActions++;
  if (!this->NoRuleMessages) {
    cmLocalUnixMakefileGenerator3::EchoProgress progress;
    this->MakeEchoProgress(progress);
    // Add the link message.
    std::string buildEcho = "Linking " + linkLanguage + " device code ";
    buildEcho += this->LocalGenerator->ConvertToOutputFormat(
      this->LocalGenerator->MaybeConvertToRelativePath(
        this->LocalGenerator->GetCurrentBinaryDirectory(),
        this->DeviceLinkObject),
      cmOutputConverter::SHELL);
    this->LocalGenerator->AppendEcho(
      commands, buildEcho, cmLocalUnixMakefileGenerator3::EchoLink, &progress);
  }
  // Clean files associated with this library.
  std::vector<std::string> libCleanFiles;
  libCleanFiles.push_back(this->LocalGenerator->MaybeConvertToRelativePath(
    this->LocalGenerator->GetCurrentBinaryDirectory(), targetOutputReal));

  // Determine whether a link script will be used.
  bool useLinkScript = this->GlobalGenerator->GetUseLinkScript();

  bool useResponseFileForObjects =
    this->CheckUseResponseFileForObjects(linkLanguage);
  bool const useResponseFileForLibs =
    this->CheckUseResponseFileForLibraries(linkLanguage);

  cmRulePlaceholderExpander::RuleVariables vars;
  vars.Language = linkLanguage.c_str();

  // Expand the rule variables.
  std::vector<std::string> real_link_commands;
  {
    bool useWatcomQuote =
      this->Makefile->IsOn(linkRuleVar + "_USE_WATCOM_QUOTE");

    // Set path conversion for link script shells.
    this->LocalGenerator->SetLinkScriptShell(useLinkScript);

    // Collect up flags to link in needed libraries.
    std::string linkLibs;
    if (this->GeneratorTarget->GetType() != cmStateEnums::STATIC_LIBRARY) {

      std::unique_ptr<cmLinkLineComputer> linkLineComputer(
        new cmLinkLineDeviceComputer(
          this->LocalGenerator,
          this->LocalGenerator->GetStateSnapshot().GetDirectory()));
      linkLineComputer->SetForResponse(useResponseFileForLibs);
      linkLineComputer->SetUseWatcomQuote(useWatcomQuote);
      linkLineComputer->SetRelink(relink);

      this->CreateLinkLibs(linkLineComputer.get(), linkLibs,
                           useResponseFileForLibs, depends);
    }

    // Construct object file lists that may be needed to expand the
    // rule.
    std::string buildObjs;
    this->CreateObjectLists(useLinkScript, false, // useArchiveRules
                            useResponseFileForObjects, buildObjs, depends,
                            useWatcomQuote);

    cmOutputConverter::OutputFormat output = (useWatcomQuote)
      ? cmOutputConverter::WATCOMQUOTE
      : cmOutputConverter::SHELL;

    std::string objectDir = this->GeneratorTarget->GetSupportDirectory();
    objectDir = this->LocalGenerator->ConvertToOutputFormat(
      this->LocalGenerator->MaybeConvertToRelativePath(
        this->LocalGenerator->GetCurrentBinaryDirectory(), objectDir),
      cmOutputConverter::SHELL);

    std::string target = this->LocalGenerator->ConvertToOutputFormat(
      this->LocalGenerator->MaybeConvertToRelativePath(
        this->LocalGenerator->GetCurrentBinaryDirectory(), targetOutputReal),
      output);

    std::string targetFullPathCompilePDB = this->ComputeTargetCompilePDB();
    std::string targetOutPathCompilePDB =
      this->LocalGenerator->ConvertToOutputFormat(targetFullPathCompilePDB,
                                                  cmOutputConverter::SHELL);

    vars.Objects = buildObjs.c_str();
    vars.ObjectDir = objectDir.c_str();
    vars.Target = target.c_str();
    vars.LinkLibraries = linkLibs.c_str();
    vars.ObjectsQuoted = buildObjs.c_str();
    vars.LinkFlags = linkFlags.c_str();
    vars.TargetCompilePDB = targetOutPathCompilePDB.c_str();

    // Add language-specific flags.
    std::string langFlags;
    this->LocalGenerator->AddLanguageFlagsForLinking(
      langFlags, this->GeneratorTarget, linkLanguage, this->ConfigName);

    vars.LanguageCompileFlags = langFlags.c_str();

    std::string launcher;
    const char* val = this->LocalGenerator->GetRuleLauncher(
      this->GeneratorTarget, "RULE_LAUNCH_LINK");
    if (val && *val) {
      launcher = val;
      launcher += " ";
    }

    std::unique_ptr<cmRulePlaceholderExpander> rulePlaceholderExpander(
      this->LocalGenerator->CreateRulePlaceholderExpander());

    // Construct the main link rule and expand placeholders.
    rulePlaceholderExpander->SetTargetImpLib(targetOutputReal);
    std::string linkRule = this->GetLinkRule(linkRuleVar);
    cmSystemTools::ExpandListArgument(linkRule, real_link_commands);

    // Expand placeholders.
    for (std::string& real_link_command : real_link_commands) {
      real_link_command = launcher + real_link_command;
      rulePlaceholderExpander->ExpandRuleVariables(this->LocalGenerator,
                                                   real_link_command, vars);
    }
    // Restore path conversion to normal shells.
    this->LocalGenerator->SetLinkScriptShell(false);

    // Clean all the possible library names and symlinks.
    this->CleanFiles.insert(this->CleanFiles.end(), libCleanFiles.begin(),
                            libCleanFiles.end());
  }

  std::vector<std::string> commands1;
  // Optionally convert the build rule to use a script to avoid long
  // command lines in the make shell.
  if (useLinkScript) {
    // Use a link script.
    const char* name = (relink ? "drelink.txt" : "dlink.txt");
    this->CreateLinkScript(name, real_link_commands, commands1, depends);
  } else {
    // No link script.  Just use the link rule directly.
    commands1 = real_link_commands;
  }
  this->LocalGenerator->CreateCDCommand(
    commands1, this->Makefile->GetCurrentBinaryDirectory(),
    this->LocalGenerator->GetBinaryDirectory());
  commands.insert(commands.end(), commands1.begin(), commands1.end());
  commands1.clear();

  // Compute the list of outputs.
  std::vector<std::string> outputs(1, targetOutputReal);

  // Write the build rule.
  this->WriteMakeRule(*this->BuildFileStream, nullptr, outputs, depends,
                      commands, false);

  // Write the main driver rule to build everything in this target.
  this->WriteTargetDriverRule(targetOutputReal, relink);
#else
  static_cast<void>(linkRuleVar);
  static_cast<void>(relink);
#endif
}